

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::MergeLinkLibraries
          (cmTarget *this,cmMakefile *mf,string *selfname,LinkLibraryVectorType *libs)

{
  pointer lib;
  allocator local_81;
  LinkLibraryVectorType *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  local_80 = &this->PrevLinkedLibraries;
  local_78 = selfname;
  for (lib = (pointer)((long)(this->PrevLinkedLibraries).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish +
                      ((long)(libs->
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                             )._M_impl.super__Vector_impl_data._M_start -
                      (long)(this->PrevLinkedLibraries).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                            ._M_impl.super__Vector_impl_data._M_start));
      lib != (libs->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
             )._M_impl.super__Vector_impl_data._M_finish; lib = lib + 1) {
    AddLinkLibrary(this,mf,local_78,&lib->first,lib->second);
    std::__cxx11::string::string((string *)&local_50,"INTERFACE_LINK_LIBRARIES",&local_81);
    GetDebugGeneratorExpressions(&local_70,this,&lib->first,lib->second);
    AppendProperty(this,&local_50,local_70._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::operator=(local_80,libs);
  return;
}

Assistant:

void cmTarget::MergeLinkLibraries( cmMakefile& mf,
                                   const std::string& selfname,
                                   const LinkLibraryVectorType& libs )
{
  // Only add on libraries we haven't added on before.
  // Assumption: the global link libraries could only grow, never shrink
  LinkLibraryVectorType::const_iterator i = libs.begin();
  i += this->PrevLinkedLibraries.size();
  for( ; i != libs.end(); ++i )
    {
    // This is equivalent to the target_link_libraries plain signature.
    this->AddLinkLibrary( mf, selfname, i->first, i->second );
    this->AppendProperty("INTERFACE_LINK_LIBRARIES",
      this->GetDebugGeneratorExpressions(i->first, i->second).c_str());
    }
  this->PrevLinkedLibraries = libs;
}